

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_get_v3i(exr_const_context_t ctxt,int part_index,char *name,exr_attr_v3i_t *out)

{
  undefined8 *puVar1;
  undefined8 *in_RCX;
  exr_attribute_t **in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  _internal_exr_part *p_Var2;
  long local_30;
  undefined4 in_stack_ffffffffffffffe8;
  _internal_exr_context *list;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  exr_result_t eVar3;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    eVar3 = 2;
  }
  else {
    list = in_RDI;
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      eVar3 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var2 = in_RDI->parts[(int)in_ESI];
      if ((in_RDX == (exr_attribute_t **)0x0) || (*(char *)in_RDX == '\0')) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        eVar3 = (*in_RDI->report_error)(in_RDI,3,"Invalid name for v3i attribute query");
      }
      else {
        eVar3 = exr_attr_list_find_by_name
                          ((exr_const_context_t)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           (exr_attribute_list_t *)list,
                           (char *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
        if (eVar3 == 0) {
          if (*(int *)(local_30 + 0x14) == 0x1a) {
            if (in_RCX == (undefined8 *)0x0) {
              if (in_RDI->mode == '\x01') {
                internal_exr_unlock(in_RDI);
              }
              eVar3 = (*in_RDI->print_error)(in_RDI,3,"NULL output for \'%s\'",in_RDX);
            }
            else {
              puVar1 = *(undefined8 **)(local_30 + 0x18);
              *in_RCX = *puVar1;
              *(undefined4 *)(in_RCX + 1) = *(undefined4 *)(puVar1 + 1);
              if (in_RDI->mode == '\x01') {
                internal_exr_unlock(in_RDI);
              }
            }
          }
          else {
            if (in_RDI->mode == '\x01') {
              internal_exr_unlock(in_RDI);
            }
            eVar3 = (*in_RDI->print_error)
                              (in_RDI,0x10,
                               "\'%s\' requested type \'v3i\', but stored attributes is type \'%s\'"
                               ,in_RDX,*(undefined8 *)(local_30 + 8),in_RDI->print_error,p_Var2);
          }
        }
        else if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
exr_attr_get_v3i (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_v3i_t*     out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_V3I, v3i);
}